

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortcutsWindow.cpp
# Opt level: O3

size_t __thiscall cursespp::ShortcutsWindow::CalculateLeftPadding(ShortcutsWindow *this)

{
  long lVar1;
  undefined8 uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  pointer psVar6;
  size_t sVar7;
  back_insert_iterator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  result;
  int iVar8;
  int iVar9;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *local_78;
  size_t local_70;
  wchar_t local_68;
  undefined4 uStack_64;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  wchar_t *local_50;
  ShortcutsWindow *local_48;
  ulong local_40;
  long local_38;
  
  if (this->alignment == AlignLeft) {
    sVar7 = 0;
  }
  else {
    uVar4 = (*(this->super_Window).super_IWindow.super_IOrderable._vptr_IOrderable[0x19])();
    psVar6 = (this->entries).
             super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->entries).
        super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != psVar6) {
      local_50 = &local_68;
      local_38 = 8;
      local_40 = 0;
      local_48 = this;
      do {
        lVar1 = *(long *)((long)psVar6 + local_38 + -8);
        local_58 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                    ((long)&(psVar6->
                            super___shared_ptr<cursespp::ShortcutsWindow::Entry,_(__gnu_cxx::_Lock_policy)2>
                            )._M_ptr + local_38);
        if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_58->_M_use_count = local_58->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_58->_M_use_count = local_58->_M_use_count + 1;
          }
        }
        local_70 = 0;
        local_68 = L'\0';
        result.container =
             (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&local_68
        ;
        local_78 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &local_68;
        utf8::
        utf8to16<std::back_insert_iterator<std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (*(utf8 **)(lVar1 + 8),
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(*(utf8 **)(lVar1 + 8) + *(long *)(lVar1 + 0x10)),
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )&local_78,
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &local_68);
        iVar5 = wcswidth((wchar_t *)local_78,local_70);
        uVar2 = *(undefined8 *)(lVar1 + 0x10);
        if (local_78 !=
            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&local_68)
        {
          operator_delete(local_78,CONCAT44(uStack_64,local_68) * 4 + 4);
        }
        iVar9 = (int)uVar2;
        if (0 < iVar5) {
          iVar9 = iVar5;
        }
        local_70 = 0;
        local_68 = L'\0';
        local_78 = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &local_68;
        utf8::
        utf8to16<std::back_insert_iterator<std::__cxx11::wstring>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                  (*(utf8 **)(lVar1 + 0x28),
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )(*(utf8 **)(lVar1 + 0x28) + *(long *)(lVar1 + 0x30)),
                   (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    )&local_78,result);
        iVar5 = wcswidth((wchar_t *)local_78,local_70);
        uVar2 = *(undefined8 *)(lVar1 + 0x30);
        if (local_78 !=
            (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)&local_68)
        {
          operator_delete(local_78,CONCAT44(uStack_64,local_68) * 4 + 4);
        }
        uVar3 = local_40;
        iVar8 = (int)uVar2;
        if (0 < iVar5) {
          iVar8 = iVar5;
        }
        if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
        }
        uVar4 = (uVar4 - (iVar8 + iVar9)) - 5;
        local_40 = uVar3 + 1;
        psVar6 = (local_48->entries).
                 super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        local_38 = local_38 + 0x10;
        this = local_48;
      } while (local_40 <
               (ulong)((long)(local_48->entries).
                             super__Vector_base<std::shared_ptr<cursespp::ShortcutsWindow::Entry>,_std::allocator<std::shared_ptr<cursespp::ShortcutsWindow::Entry>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)psVar6 >> 4));
    }
    sVar7 = 0;
    if (-1 < (int)uVar4) {
      sVar7 = (size_t)(uVar4 >> (this->alignment != AlignRight));
    }
  }
  return sVar7;
}

Assistant:

size_t ShortcutsWindow::CalculateLeftPadding() {
    if (this->alignment == text::AlignLeft) {
        return 0;
    }

    int padding = this->GetContentWidth();

    for (size_t i = 0; i < this->entries.size(); i++) {
        auto e = this->entries[i];
        padding -= u8cols(e->key) + u8cols(e->description) + 5;
    }

    if (padding < 0) {
        return 0;
    }

    if (this->alignment == text::AlignRight) {
        return padding;
    }

    return (padding / 2); /* text::AlignCenter */
}